

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::validateKTXswizzle(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_type *psVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string_view fmt;
  format_args args;
  string_view value;
  uint32_t local_a4;
  size_type *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  size_type local_88;
  undefined8 uStack_80;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  ulong local_48 [3];
  
  this->foundKTXswizzle = true;
  local_a4 = size;
  if ((size == 0) || (data[size - 1] != '\0')) {
    error<>(this,&Metadata::KTXswizzleMissingNull);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  psVar4 = (size_type *)(ulong)(iVar2 + size);
  local_a0 = psVar4;
  local_58._M_len = (size_t)psVar4;
  local_58._M_str = (char *)data;
  if (iVar2 + size != 4) {
    error<unsigned_int&>(this,&Metadata::KTXswizzleInvalidSize,&local_a4);
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    if (psVar4 == (size_type *)0x0) goto LAB_001aea98;
  }
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  psVar4 = (size_type *)0x4;
  if (local_a0 < (size_type *)0x4) {
    psVar4 = local_a0;
  }
  do {
    paVar5 = local_98;
    pcVar3 = (char *)memchr("rgba01",(int)(char)data[(long)local_98],6);
    if (pcVar3 == (char *)0x0 || pcVar3 == "") {
      error<unsigned_long&,char_const&>
                (this,&Metadata::KTXswizzleInvalidValue,(unsigned_long *)&local_98,
                 paVar5->_M_local_buf + (long)data);
      paVar5 = local_98;
    }
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar5->_M_local_buf + 1);
  } while (local_98 < psVar4);
LAB_001aea98:
  psVar4 = local_a0;
  uVar1 = (this->header).vkFormat;
  if (uVar1 - 0x7c < 7) {
    pcVar3 = (char *)vkFormatString((ulong)uVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,pcVar3,(allocator<char> *)local_48);
    iVar2 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar2 == 0) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_48;
      local_48[0] = (ulong)uVar1;
      ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)0x20aba6,fmt,args);
      if (local_98 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_88) {
        operator_delete(local_98,local_88 + 1);
      }
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      if (local_98 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_88) {
        local_78.field_2._8_8_ = uStack_80;
      }
      else {
        local_78._M_dataplus._M_p = (pointer)local_98;
      }
      local_78.field_2._M_allocated_capacity = local_88;
      local_78._M_string_length = local_90;
    }
    warning<std::__cxx11::string>(this,&Metadata::KTXswizzleWithDepthOrStencil,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->checkGLTFBasisU == true) && (((int)psVar4 != 4 || (*(int *)data != 0x61626772)))) {
    error<std::basic_string_view<char,std::char_traits<char>>const&>
              (this,&Metadata::KTXswizzleInvalidGLTFBU,&local_58);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXswizzle(const uint8_t* data, uint32_t size) {
    foundKTXswizzle = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXswizzleMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != 4)
        error(Metadata::KTXswizzleInvalidSize, size);

    for (std::size_t i = 0; i < std::min(std::size_t{4}, value.size()); ++i) {
        if (value.size() > i && !contains("rgba01", value[i]))
            error(Metadata::KTXswizzleInvalidValue, i, value[i]);
    }

    if (isFormatStencil(VkFormat(header.vkFormat)) || isFormatDepth(VkFormat(header.vkFormat)))
        warning(Metadata::KTXswizzleWithDepthOrStencil, toString(VkFormat(header.vkFormat)));

    if (checkGLTFBasisU && value != "rgba")
        error(Metadata::KTXswizzleInvalidGLTFBU, value);
}